

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O0

void __thiscall net_uv::KCPServer::run(KCPServer *this)

{
  int __fd;
  KCPServer *this_local;
  
  Runnable::startIdle((Runnable *)this);
  __fd = 0;
  UVLoop::run(&(this->super_Server).super_Runnable.m_loop,UV_RUN_DEFAULT);
  if (this->m_server != (KCPSocket *)0x0) {
    (**(this->m_server->super_Socket)._vptr_Socket)();
    free(this->m_server);
    this->m_server = (KCPSocket *)0x0;
  }
  UVLoop::close(&(this->super_Server).super_Runnable.m_loop,__fd);
  (this->super_Server).m_serverStage = STOP;
  (*(this->super_Server).super_Runnable._vptr_Runnable[5])(this,7,0,0,0);
  return;
}

Assistant:

void KCPServer::run()
{
	startIdle();

	m_loop.run(UV_RUN_DEFAULT);

	if (m_server)
	{
		m_server->~KCPSocket();
		fc_free(m_server);
		m_server = NULL;
	}

	m_loop.close();

	m_serverStage = ServerStage::STOP;
	pushThreadMsg(NetThreadMsgType::EXIT_LOOP, NULL);
}